

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _d,int _c,Allocator *_allocator)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  Allocator *unaff_retaddr;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  size_t in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  Mat *in_stack_fffffffffffffdf0;
  Mat *pMVar2;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  void *local_1a0;
  int *local_198;
  long *local_180;
  int local_148;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] == in_EDX * in_ECX * in_R8D * in_R9D) {
    if ((int)in_RSI[5] < 3) {
      if ((long)in_EDX * (long)in_ECX * (long)in_R8D !=
          ((long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2] + 0xfU & 0xfffffffffffffff0) /
          (ulong)in_RSI[2]) {
        in_RDI->data = (void *)0x0;
        in_RDI->refcount = (int *)0x0;
        in_RDI->elemsize = 0;
        in_RDI->elempack = 0;
        in_RDI->allocator = (Allocator *)0x0;
        in_RDI->dims = 0;
        in_RDI->w = 0;
        in_RDI->h = 0;
        in_RDI->d = 0;
        in_RDI->c = 0;
        in_RDI->cstep = 0;
        pMVar2 = in_RDI;
        create(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
               (int)in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
               (int)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(int)in_RSI,
               (Allocator *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        for (local_148 = 0; local_148 < in_R9D; local_148 = local_148 + 1) {
          memcpy((void *)((long)in_RDI->data + (long)local_148 * in_RDI->cstep * in_RDI->elemsize),
                 (void *)(*in_RSI +
                         (long)local_148 * (long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2]),
                 (long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2]);
        }
        return pMVar2;
      }
    }
    else if ((int)in_RSI[7] != in_R9D) {
      reshape((Mat *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
              (int)((ulong)in_RSI >> 0x20),(Allocator *)in_RDI);
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,in_stack_fffffffffffffecc,
              in_stack_fffffffffffffec8,unaff_retaddr);
      if (local_198 == (int *)0x0) {
        return in_RDI;
      }
      LOCK();
      iVar1 = *local_198;
      *local_198 = *local_198 + -1;
      UNLOCK();
      if (iVar1 != 1) {
        return in_RDI;
      }
      if (local_180 != (long *)0x0) {
        (**(code **)(*local_180 + 0x18))(local_180,local_1a0);
        return in_RDI;
      }
      if (local_1a0 == (void *)0x0) {
        return in_RDI;
      }
      free(local_1a0);
      return in_RDI;
    }
    in_RDI->data = (void *)*in_RSI;
    in_RDI->refcount = (int *)in_RSI[1];
    in_RDI->elemsize = in_RSI[2];
    in_RDI->elempack = (int)in_RSI[3];
    in_RDI->allocator = (Allocator *)in_RSI[4];
    in_RDI->dims = (int)in_RSI[5];
    in_RDI->w = *(int *)((long)in_RSI + 0x2c);
    in_RDI->h = (int)in_RSI[6];
    in_RDI->d = *(int *)((long)in_RSI + 0x34);
    in_RDI->c = (int)in_RSI[7];
    in_RDI->cstep = in_RSI[8];
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
    in_RDI->dims = 4;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->d = in_R8D;
    in_RDI->c = in_R9D;
    in_RDI->cstep =
         ((long)in_EDX * (long)in_ECX * (long)in_R8D * in_RSI[2] + 0xfU & 0xfffffffffffffff0) /
         (ulong)in_RSI[2];
  }
  else {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _d, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _d * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h * _d != alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _d, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * _d * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * _d * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _d * _c, _allocator);
        return tmp.reshape(_w, _h, _d, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 4;
    m.w = _w;
    m.h = _h;
    m.d = _d;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize;

    return m;
}